

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

BOOL Js::JavascriptConversion::CanonicalNumericIndexString
               (JavascriptString *aValue,double *indexValue,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptString *aLeft;
  double value;
  
  bVar1 = JavascriptString::IsNegZero(aValue);
  value = 0.0;
  if (!bVar1) {
    value = JavascriptString::ToDouble(aValue);
    aLeft = JavascriptNumber::ToStringRadix10(value,scriptContext);
    bVar1 = JavascriptString::Equals(aLeft,aValue);
    if (!bVar1) {
      return 0;
    }
  }
  *indexValue = value;
  return 1;
}

Assistant:

BOOL JavascriptConversion::CanonicalNumericIndexString(JavascriptString *aValue, double *indexValue, ScriptContext * scriptContext)
    {
        if (JavascriptString::IsNegZero(aValue))
        {
            *indexValue = -0;
            return TRUE;
        }

        double indexDoubleValue = aValue->ToDouble();
        if (JavascriptString::Equals(JavascriptNumber::ToStringRadix10(indexDoubleValue, scriptContext), aValue))
        {
            *indexValue = indexDoubleValue;
            return TRUE;
        }

        return FALSE;
    }